

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O0

void Llb_Nonlin4Free(Llb_Mgr_t_conflict *p)

{
  Llb_Var_t *pVar_00;
  Llb_Prt_t *pPart_00;
  int local_24;
  int i;
  Llb_Var_t *pVar;
  Llb_Prt_t *pPart;
  Llb_Mgr_t_conflict *p_local;
  
  for (local_24 = 0; local_24 < p->nVars; local_24 = local_24 + 1) {
    pVar_00 = Llb_MgrVar(p,local_24);
    if (pVar_00 != (Llb_Var_t *)0x0) {
      Llb_Nonlin4RemoveVar(p,pVar_00);
    }
  }
  for (local_24 = 0; local_24 < p->iPartFree; local_24 = local_24 + 1) {
    pPart_00 = Llb_MgrPart(p,local_24);
    if (pPart_00 != (Llb_Prt_t *)0x0) {
      Llb_Nonlin4RemovePart(p,pPart_00);
    }
  }
  if (p->pVars != (Llb_Var_t **)0x0) {
    free(p->pVars);
    p->pVars = (Llb_Var_t **)0x0;
  }
  if (p->pParts != (Llb_Prt_t **)0x0) {
    free(p->pParts);
    p->pParts = (Llb_Prt_t **)0x0;
  }
  if (p->pSupp != (int *)0x0) {
    free(p->pSupp);
    p->pSupp = (int *)0x0;
  }
  if (p != (Llb_Mgr_t_conflict *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Llb_Nonlin4Free( Llb_Mgr_t * p )
{
    Llb_Prt_t * pPart;
    Llb_Var_t * pVar;
    int i;
    Llb_MgrForEachVar( p, pVar, i )
        Llb_Nonlin4RemoveVar( p, pVar );
    Llb_MgrForEachPart( p, pPart, i )
        Llb_Nonlin4RemovePart( p, pPart );
    ABC_FREE( p->pVars );
    ABC_FREE( p->pParts );
    ABC_FREE( p->pSupp );
    ABC_FREE( p );
}